

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

string * __thiscall
CodeGen::generateType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  NodePtr nn;
  NodePtr local_20;
  
  peVar2 = n->px;
  if (peVar2->type_ == AVRO_NUM_TYPES) {
    avro::resolveSymbol((avro *)&local_20,n);
  }
  else {
    local_20.pn.pi_ = (n->pn).pi_;
    local_20.px = peVar2;
    if ((_Base_ptr)local_20.pn.pi_ != (_Base_ptr)0x0) {
      LOCK();
      *(uint_least32_t *)&((_Base_ptr)local_20.pn.pi_)->_M_parent =
           *(uint_least32_t *)&((_Base_ptr)local_20.pn.pi_)->_M_parent + 1;
      UNLOCK();
    }
  }
  p_Var5 = (this->done)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->done)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      bVar6 = p_Var5[1]._M_parent < local_20.pn.pi_;
      if (!bVar6) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar6];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var3[1]._M_parent <= local_20.pn.pi_)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var3[1]._M_left,
                 (long)&(p_Var3[1]._M_left)->_M_color + (long)&(p_Var3[1]._M_right)->_M_color);
      goto LAB_00146757;
    }
  }
  doGenerateType_abi_cxx11_(__return_storage_ptr__,this,&local_20);
  pmVar4 = std::
           map<boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->done,&local_20);
  std::__cxx11::string::_M_assign((string *)pmVar4);
LAB_00146757:
  boost::detail::shared_count::~shared_count(&local_20.pn);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateType(const NodePtr& n)
{
    NodePtr nn = (n->type() == avro::AVRO_SYMBOLIC) ?  resolveSymbol(n) : n;

    map<NodePtr, string>::const_iterator it = done.find(nn);
    if (it != done.end()) {
        return it->second;
    }
    string result = doGenerateType(nn);
    done[nn] = result;
    return result;
}